

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# encode_api_test.cc
# Opt level: O0

void __thiscall
anon_unknown.dwarf_a078f1::EncodeAPI_AomediaIssue3509VbrMinSection101Percent_Test::TestBody
          (EncodeAPI_AomediaIssue3509VbrMinSection101Percent_Test *this)

{
  bool bVar1;
  AssertHelper *this_00;
  AssertionResult gtest_ar_4;
  AssertionResult gtest_ar_3;
  AssertionResult gtest_ar_2;
  aom_image_t *image;
  AssertionResult gtest_ar_1;
  AssertionResult gtest_ar;
  aom_codec_enc_cfg_t cfg;
  aom_codec_ctx_t enc;
  aom_codec_iface_t *iface;
  aom_codec_ctx_t *in_stack_fffffffffffffb18;
  AssertHelper *in_stack_fffffffffffffb20;
  aom_codec_enc_cfg_t *in_stack_fffffffffffffb28;
  aom_codec_iface_t *in_stack_fffffffffffffb30;
  char *in_stack_fffffffffffffb38;
  int line;
  aom_codec_enc_cfg_t *in_stack_fffffffffffffb40;
  undefined4 in_stack_fffffffffffffb48;
  Type in_stack_fffffffffffffb4c;
  aom_codec_ctx_t *in_stack_fffffffffffffb50;
  AssertionResult local_4a0 [2];
  undefined4 local_480;
  aom_codec_err_t local_47c;
  AssertionResult local_478;
  Message *in_stack_fffffffffffffb98;
  AssertHelper *in_stack_fffffffffffffba0;
  AssertionResult local_450;
  aom_image_t *local_440;
  undefined4 local_428;
  aom_codec_err_t local_424;
  AssertionResult local_420;
  uint local_40c;
  undefined4 local_3e8;
  aom_codec_err_t local_3e4;
  AssertionResult local_3e0;
  undefined4 local_3c4;
  undefined4 local_3c0;
  undefined4 local_348;
  undefined4 local_324;
  aom_codec_iface_t *local_10;
  
  local_10 = aom_codec_av1_cx();
  local_3e4 = aom_codec_enc_config_default
                        (in_stack_fffffffffffffb30,in_stack_fffffffffffffb28,
                         (uint)((ulong)in_stack_fffffffffffffb20 >> 0x20));
  local_3e8 = 0;
  testing::internal::EqHelper::Compare<aom_codec_err_t,_aom_codec_err_t,_nullptr>
            (in_stack_fffffffffffffb38,(char *)in_stack_fffffffffffffb30,
             &in_stack_fffffffffffffb28->g_usage,(aom_codec_err_t *)in_stack_fffffffffffffb20);
  bVar1 = testing::AssertionResult::operator_cast_to_bool(&local_3e0);
  if (!bVar1) {
    testing::Message::Message((Message *)in_stack_fffffffffffffb50);
    in_stack_fffffffffffffb40 =
         (aom_codec_enc_cfg_t *)
         testing::AssertionResult::failure_message((AssertionResult *)0x801657);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)in_stack_fffffffffffffb50,in_stack_fffffffffffffb4c,
               (char *)in_stack_fffffffffffffb40,(int)((ulong)in_stack_fffffffffffffb38 >> 0x20),
               (char *)in_stack_fffffffffffffb30);
    testing::internal::AssertHelper::operator=(in_stack_fffffffffffffba0,in_stack_fffffffffffffb98);
    testing::internal::AssertHelper::~AssertHelper(in_stack_fffffffffffffb20);
    testing::Message::~Message((Message *)0x8016b4);
  }
  local_40c = (uint)!bVar1;
  testing::AssertionResult::~AssertionResult((AssertionResult *)0x80173b);
  if (local_40c == 0) {
    local_3c4 = 0x780;
    local_3c0 = 0x438;
    local_348 = 1000000;
    local_324 = 0x65;
    local_424 = aom_codec_enc_init_ver
                          (in_stack_fffffffffffffb50,
                           (aom_codec_iface_t *)
                           CONCAT44(in_stack_fffffffffffffb4c,in_stack_fffffffffffffb48),
                           in_stack_fffffffffffffb40,(aom_codec_flags_t)in_stack_fffffffffffffb38,
                           (int)((ulong)in_stack_fffffffffffffb30 >> 0x20));
    local_428 = 0;
    testing::internal::EqHelper::Compare<aom_codec_err_t,_aom_codec_err_t,_nullptr>
              (in_stack_fffffffffffffb38,(char *)in_stack_fffffffffffffb30,
               &in_stack_fffffffffffffb28->g_usage,(aom_codec_err_t *)in_stack_fffffffffffffb20);
    bVar1 = testing::AssertionResult::operator_cast_to_bool(&local_420);
    if (!bVar1) {
      testing::Message::Message((Message *)in_stack_fffffffffffffb50);
      in_stack_fffffffffffffb38 =
           testing::AssertionResult::failure_message((AssertionResult *)0x801823);
      testing::internal::AssertHelper::AssertHelper
                ((AssertHelper *)in_stack_fffffffffffffb50,in_stack_fffffffffffffb4c,
                 (char *)in_stack_fffffffffffffb40,(int)((ulong)in_stack_fffffffffffffb38 >> 0x20),
                 (char *)in_stack_fffffffffffffb30);
      testing::internal::AssertHelper::operator=
                (in_stack_fffffffffffffba0,in_stack_fffffffffffffb98);
      testing::internal::AssertHelper::~AssertHelper(in_stack_fffffffffffffb20);
      testing::Message::~Message((Message *)0x801880);
    }
    local_40c = (uint)!bVar1;
    testing::AssertionResult::~AssertionResult((AssertionResult *)0x801907);
    if (local_40c == 0) {
      local_440 = CreateGrayImage((aom_img_fmt_t)((ulong)in_stack_fffffffffffffb38 >> 0x20),
                                  (uint)in_stack_fffffffffffffb38,
                                  (uint)((ulong)in_stack_fffffffffffffb30 >> 0x20));
      testing::internal::CmpHelperNE<aom_image*,decltype(nullptr)>
                (in_stack_fffffffffffffb38,(char *)in_stack_fffffffffffffb30,
                 (aom_image **)in_stack_fffffffffffffb28,&in_stack_fffffffffffffb20->data_);
      bVar1 = testing::AssertionResult::operator_cast_to_bool(&local_450);
      if (!bVar1) {
        testing::Message::Message((Message *)in_stack_fffffffffffffb50);
        in_stack_fffffffffffffb30 =
             (aom_codec_iface_t *)
             testing::AssertionResult::failure_message((AssertionResult *)0x8019b6);
        testing::internal::AssertHelper::AssertHelper
                  ((AssertHelper *)in_stack_fffffffffffffb50,in_stack_fffffffffffffb4c,
                   (char *)in_stack_fffffffffffffb40,(int)((ulong)in_stack_fffffffffffffb38 >> 0x20)
                   ,(char *)in_stack_fffffffffffffb30);
        testing::internal::AssertHelper::operator=
                  (in_stack_fffffffffffffba0,in_stack_fffffffffffffb98);
        testing::internal::AssertHelper::~AssertHelper(in_stack_fffffffffffffb20);
        testing::Message::~Message((Message *)0x801a13);
      }
      local_40c = (uint)!bVar1;
      testing::AssertionResult::~AssertionResult((AssertionResult *)0x801a9a);
      if (local_40c == 0) {
        local_47c = aom_codec_encode(in_stack_fffffffffffffb50,
                                     (aom_image_t *)
                                     CONCAT44(in_stack_fffffffffffffb4c,in_stack_fffffffffffffb48),
                                     (aom_codec_pts_t)in_stack_fffffffffffffb40,
                                     (unsigned_long)in_stack_fffffffffffffb38,
                                     (aom_enc_frame_flags_t)in_stack_fffffffffffffb30);
        local_480 = 0;
        testing::internal::EqHelper::Compare<aom_codec_err_t,_aom_codec_err_t,_nullptr>
                  (in_stack_fffffffffffffb38,(char *)in_stack_fffffffffffffb30,
                   &in_stack_fffffffffffffb28->g_usage,(aom_codec_err_t *)in_stack_fffffffffffffb20)
        ;
        bVar1 = testing::AssertionResult::operator_cast_to_bool(&local_478);
        if (!bVar1) {
          testing::Message::Message((Message *)in_stack_fffffffffffffb50);
          in_stack_fffffffffffffb28 =
               (aom_codec_enc_cfg_t *)
               testing::AssertionResult::failure_message((AssertionResult *)0x801b39);
          testing::internal::AssertHelper::AssertHelper
                    ((AssertHelper *)in_stack_fffffffffffffb50,in_stack_fffffffffffffb4c,
                     (char *)in_stack_fffffffffffffb40,
                     (int)((ulong)in_stack_fffffffffffffb38 >> 0x20),
                     (char *)in_stack_fffffffffffffb30);
          testing::internal::AssertHelper::operator=
                    (in_stack_fffffffffffffba0,in_stack_fffffffffffffb98);
          testing::internal::AssertHelper::~AssertHelper(in_stack_fffffffffffffb20);
          testing::Message::~Message((Message *)0x801b87);
        }
        local_40c = (uint)!bVar1;
        testing::AssertionResult::~AssertionResult((AssertionResult *)0x801c05);
        if (local_40c == 0) {
          aom_img_free((aom_image_t *)0x801c24);
          aom_codec_destroy(in_stack_fffffffffffffb18);
          testing::internal::EqHelper::Compare<aom_codec_err_t,_aom_codec_err_t,_nullptr>
                    (in_stack_fffffffffffffb38,(char *)in_stack_fffffffffffffb30,
                     &in_stack_fffffffffffffb28->g_usage,
                     (aom_codec_err_t *)in_stack_fffffffffffffb20);
          line = (int)((ulong)in_stack_fffffffffffffb38 >> 0x20);
          bVar1 = testing::AssertionResult::operator_cast_to_bool(local_4a0);
          if (!bVar1) {
            testing::Message::Message((Message *)in_stack_fffffffffffffb50);
            this_00 = (AssertHelper *)
                      testing::AssertionResult::failure_message((AssertionResult *)0x801c99);
            testing::internal::AssertHelper::AssertHelper
                      ((AssertHelper *)in_stack_fffffffffffffb50,in_stack_fffffffffffffb4c,
                       (char *)in_stack_fffffffffffffb40,line,(char *)in_stack_fffffffffffffb30);
            testing::internal::AssertHelper::operator=
                      (in_stack_fffffffffffffba0,in_stack_fffffffffffffb98);
            testing::internal::AssertHelper::~AssertHelper(this_00);
            testing::Message::~Message((Message *)0x801ce7);
          }
          local_40c = (uint)!bVar1;
          testing::AssertionResult::~AssertionResult((AssertionResult *)0x801d5f);
        }
      }
    }
  }
  return;
}

Assistant:

TEST(EncodeAPI, AomediaIssue3509VbrMinSection101Percent) {
  // Initialize libaom encoder.
  aom_codec_iface_t *const iface = aom_codec_av1_cx();
  aom_codec_ctx_t enc;
  aom_codec_enc_cfg_t cfg;

  ASSERT_EQ(aom_codec_enc_config_default(iface, &cfg, AOM_USAGE_REALTIME),
            AOM_CODEC_OK);

  cfg.g_w = 1920;
  cfg.g_h = 1080;
  cfg.rc_target_bitrate = 1000000;
  // Set this to more than 100 percent to cause an error when vbr_min_bits is
  // cast to `int` in av1_rc_update_framerate() if vbr_min_bits is not clamped
  // to INT_MAX.
  cfg.rc_2pass_vbr_minsection_pct = 101;

  ASSERT_EQ(aom_codec_enc_init(&enc, iface, &cfg, 0), AOM_CODEC_OK);

  // Create input image.
  aom_image_t *const image =
      CreateGrayImage(AOM_IMG_FMT_I420, cfg.g_w, cfg.g_h);
  ASSERT_NE(image, nullptr);

  // Encode frame.
  // `duration` can go as high as 300, but the UBSan error is gone if
  // `duration` is 301 or higher.
  ASSERT_EQ(aom_codec_encode(&enc, image, 0, /*duration=*/300, 0),
            AOM_CODEC_OK);

  // Free resources.
  aom_img_free(image);
  ASSERT_EQ(aom_codec_destroy(&enc), AOM_CODEC_OK);
}